

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O3

string * __thiscall
loader::to_string_abi_cxx11_(string *__return_storage_ptr__,loader *this,ze_init_flags_t flags)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  uint __val;
  char *pcVar5;
  uint uVar6;
  
  if (((ulong)this & 1) == 0) {
    if (((ulong)this & 2) == 0) {
      uVar6 = (uint)this;
      if (uVar6 != 0) {
        __val = -uVar6;
        if (0 < (int)uVar6) {
          __val = uVar6;
        }
        uVar6 = 1;
        if (9 < __val) {
          uVar3 = (ulong)__val;
          uVar1 = 4;
          do {
            uVar6 = uVar1;
            uVar2 = (uint)uVar3;
            if (uVar2 < 100) {
              uVar6 = uVar6 - 2;
              goto LAB_0017c05b;
            }
            if (uVar2 < 1000) {
              uVar6 = uVar6 - 1;
              goto LAB_0017c05b;
            }
            if (uVar2 < 10000) goto LAB_0017c05b;
            uVar3 = uVar3 / 10000;
            uVar1 = uVar6 + 4;
          } while (99999 < uVar2);
          uVar6 = uVar6 + 1;
        }
LAB_0017c05b:
        uVar3 = (ulong)this >> 0x1f & 1;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar6 + (char)uVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((__return_storage_ptr__->_M_dataplus)._M_p + uVar3,uVar6,__val);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "0(ZE_INIT_ALL_DRIVER_TYPES_ENABLED)";
      pcVar4 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "ZE_INIT_FLAG_VPU_ONLY";
      pcVar4 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "ZE_INIT_FLAG_GPU_ONLY";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_init_flags_t flags) {
        if (flags & ZE_INIT_FLAG_GPU_ONLY) {
            return "ZE_INIT_FLAG_GPU_ONLY";
        } else if (flags & ZE_INIT_FLAG_VPU_ONLY) {
            return "ZE_INIT_FLAG_VPU_ONLY";
        } else if (flags == 0) {
            return "0(ZE_INIT_ALL_DRIVER_TYPES_ENABLED)";
        } else {
            return (std::to_string(static_cast<int>(flags)));
        }
    }